

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::OutputFile::writePixels(OutputFile *this,int numScanLines)

{
  int *piVar1;
  int scanLineMin;
  Data *pDVar2;
  pointer ppLVar3;
  LineBuffer *pLVar4;
  pointer ppLVar5;
  LineBufferTask *pLVar6;
  ArgExc *pAVar7;
  IoExc *this_00;
  int iVar8;
  size_t i;
  long lVar9;
  string *psVar10;
  ulong uVar11;
  string *psVar12;
  int scanLineMin_00;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  TaskGroup taskGroup;
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  uVar13 = (long)(pDVar2->currentScanLine - pDVar2->minY) / (long)pDVar2->linesInBuffer;
  uVar11 = uVar13 & 0xffffffff;
  IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
  pDVar2 = this->_data;
  scanLineMin = pDVar2->currentScanLine;
  iVar15 = (int)uVar13;
  if (pDVar2->lineOrder == INCREASING_Y) {
    local_1d4 = numScanLines + scanLineMin + -1;
    local_1e8 = (local_1d4 - pDVar2->minY) / pDVar2->linesInBuffer;
    local_1e4 = (local_1e8 - iVar15) + 1;
    iVar8 = (int)((ulong)((long)(pDVar2->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pDVar2->lineBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar8 <= local_1e4) {
      local_1e4 = iVar8;
    }
    iVar8 = 1;
    if (local_1e4 < 2) {
      local_1e4 = 1;
    }
    iVar14 = local_1e4;
    while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
      pLVar6 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar6,&taskGroup,this->_data,(int)uVar11,scanLineMin,local_1d4);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    local_1e8 = local_1e8 + 1;
  }
  else {
    local_1e8 = ((scanLineMin - (pDVar2->minY + numScanLines)) + 1) / pDVar2->linesInBuffer;
    scanLineMin_00 = (scanLineMin - numScanLines) + 1;
    iVar8 = (iVar15 - local_1e8) + 1;
    iVar14 = (int)((ulong)((long)(pDVar2->lineBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar2->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar14 <= iVar8) {
      iVar8 = iVar14;
    }
    iVar14 = 1;
    local_1e4 = 1;
    if (1 < iVar8) {
      iVar14 = iVar8;
      local_1e4 = iVar8;
    }
    while (iVar14 != 0) {
      pLVar6 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar6,&taskGroup,this->_data,(int)uVar11,scanLineMin_00,scanLineMin);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
      uVar11 = (ulong)((int)uVar11 - 1);
      iVar14 = iVar14 + -1;
    }
    local_1e4 = -local_1e4;
    local_1e8 = local_1e8 + -1;
    iVar8 = -1;
    local_1d4 = scanLineMin;
    scanLineMin = scanLineMin_00;
  }
  local_1e4 = iVar15 + local_1e4;
  uVar13 = (ulong)iVar15;
  while( true ) {
    iVar15 = iVar15 + iVar8;
    pDVar2 = this->_data;
    if (pDVar2->missingScanLines < 1) {
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar7,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    ppLVar3 = (pDVar2->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = ppLVar3[uVar13 % (ulong)((long)(pDVar2->lineBuffers).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppLVar3 >> 3)];
    IlmThread_2_5::Semaphore::wait();
    iVar14 = (pLVar4->scanLineMax - pLVar4->scanLineMin) + 1;
    pDVar2 = this->_data;
    pDVar2->missingScanLines = pDVar2->missingScanLines - iVar14;
    bVar16 = pLVar4->partiallyFull;
    if (bVar16 == true) break;
    anon_unknown_7::writePixelData
              (pDVar2->_streamData,pDVar2,pLVar4->minY,pLVar4->dataPtr,pLVar4->dataSize);
    piVar1 = &this->_data->currentScanLine;
    *piVar1 = *piVar1 + iVar14 * iVar8;
    IlmThread_2_5::Semaphore::post();
    if (local_1e8 == iVar15) goto LAB_00442b33;
    iVar14 = local_1e8;
    if (local_1e4 != local_1e8) {
      pLVar6 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar6,&taskGroup,this->_data,local_1e4,scanLineMin,local_1d4);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
      iVar14 = local_1e4 + iVar8;
    }
    uVar13 = uVar13 + (long)iVar8;
    local_1e4 = iVar14;
  }
  pDVar2->currentScanLine = pDVar2->currentScanLine + iVar14 * iVar8;
  IlmThread_2_5::Semaphore::post();
LAB_00442b33:
  IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
  if (bVar16 == false) {
    ppLVar3 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar10 = (string *)0x0;
    for (lVar9 = 0; (long)ppLVar5 - (long)ppLVar3 >> 3 != lVar9; lVar9 = lVar9 + 1) {
      pLVar4 = ppLVar3[lVar9];
      psVar12 = (string *)&pLVar4->exception;
      if (psVar10 != (string *)0x0) {
        psVar12 = psVar10;
      }
      if (pLVar4->hasException != false) {
        psVar10 = psVar12;
      }
      pLVar4->hasException = false;
    }
    if (psVar10 != (string *)0x0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_00,psVar10);
      __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
  }
  IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
  return;
}

Assistant:

void	
OutputFile::writePixels (int numScanLines)
{
    try
    {
        Lock lock (*_data->_streamData);

	if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first = (_data->currentScanLine - _data->minY) /
                         _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
	    // all tasks are complete.
            //
            
            TaskGroup taskGroup;
            
            //
            // Determine the range of lineBuffers that intersect the scan
	    // line range.  Then add the initial compression tasks to the
	    // thread pool.  We always add in at least one task but the
	    // individual task might not do anything if numScanLines == 0.
            //
    
            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;
    
                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;
    
                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         last - first + 1),
				    1);

                for (int i = 0; i < numTasks; i++)
		{
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first + i,
                                             scanLineMin, scanLineMax));
		}
    
                nextCompressBuffer = first + numTasks;
                stop = last + 1;
                step = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;
    
                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;
    
                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         first - last + 1),
				    1);

                for (int i = 0; i < numTasks; i++)
		{
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first - i,
                                             scanLineMin, scanLineMax));
		}
    
                nextCompressBuffer = first - numTasks;
                stop = last - 1;
                step = -1;
            }
            
            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc ("Tried to write more scan lines "
                                       "than specified by the data window.");
                }
    
		//
                // Wait until the next line buffer is ready to be written
		//

                LineBuffer *writeBuffer =
		    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait();
                
                int numLines = writeBuffer->scanLineMax - 
                               writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;
    
		//
                // If the line buffer is only partially full, then it is
		// not complete and we cannot write it to disk yet.
		//

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine = _data->currentScanLine +
                                             step * numLines;
                    writeBuffer->post();
    
                    return;
                }
    
		//
                // Write the line buffer
		//

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine = _data->currentScanLine +
                                         step * numLines;
    
                #ifdef DEBUG
    
                    assert (_data->currentScanLine ==
                            ((_data->lineOrder == INCREASING_Y) ?
                             writeBuffer->scanLineMax + 1:
                             writeBuffer->scanLineMin - 1));
    
                #endif
                
		//
                // Release the lock on the line buffer
		//

                writeBuffer->post();
                
		//
                // If this was the last line buffer in the scanline range
		//

                if (nextWriteBuffer == stop)
                    break;
    
		//
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
		//

                if (nextCompressBuffer == stop)
                    continue;
    
		//
                // Add nextCompressBuffer as a compression task
		//

                ThreadPool::addGlobalTask
                    (new LineBufferTask (&taskGroup, _data, nextCompressBuffer,
                                         scanLineMin, scanLineMax));
                
		//
                // Update the next line buffer we need to compress
		//

                nextCompressBuffer += step;
            }
        
	    //
            // Finish all tasks
	    //
        }
        
	//
	// Exeption handling:
	//
	// LineBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to OutputFile::writePixels().
	// LineBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the line buffers.
	// Now we check if any line buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple line buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
	{
            LineBuffer *lineBuffer = _data->lineBuffers[i];

	    if (lineBuffer->hasException && !exception)
		exception = &lineBuffer->exception;

	    lineBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Failed to write pixel data to image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}